

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1500.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  CURLcode CVar2;
  CURLMcode CVar3;
  undefined8 uVar4;
  long lVar5;
  timeval tVar6;
  timeval older;
  timeval older_00;
  CURLMcode ec_5;
  undefined1 local_7c [4];
  undefined1 auStack_78 [4];
  int num;
  CURLcode local_64;
  CURLcode local_60;
  CURLMcode ec_4;
  CURLMcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_48;
  long local_40;
  CURLMsg *msg;
  CURLcode local_30;
  int res;
  int i;
  int still_running;
  CURLM *multi;
  CURL *curls;
  char *URL_local;
  
  multi = (CURLM *)0x0;
  _i = 0;
  local_30 = CURLE_USE_SSL_FAILED|CURLE_SEND_ERROR;
  msg._4_4_ = CURLE_OK;
  curls = (CURL *)URL;
  _ec_1 = tutil_tvnow();
  tv_test_start.tv_sec = _ec_1;
  tv_test_start.tv_usec = local_48;
  CVar2 = curl_global_init(3);
  uVar1 = _stderr;
  ec_2 = CVar2;
  if (CVar2 != CURLE_OK) {
    uVar4 = curl_easy_strerror(CVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                  ,0x29,CVar2,uVar4);
    msg._4_4_ = ec_2;
  }
  if (msg._4_4_ == CURLE_OK) {
    _i = curl_multi_init();
    if (_i == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                    ,0x2b);
      msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_SSL_CIPHER;
    }
    if (msg._4_4_ == CURLE_OK) {
      multi = (CURLM *)curl_easy_init();
      if (multi == (CURLM *)0x0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                      ,0x2d);
        msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_SSL_CACERT;
      }
      if (msg._4_4_ == CURLE_OK) {
        CVar3 = curl_easy_setopt(multi,0x2712,curls);
        uVar1 = _stderr;
        ec_3 = CVar3;
        if (CVar3 != CURLM_OK) {
          uVar4 = curl_easy_strerror(CVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                        ,0x2f,CVar3,uVar4);
          msg._4_4_ = ec_3;
        }
        if (msg._4_4_ == CURLE_OK) {
          CVar3 = curl_easy_setopt(multi,0x2a,1);
          uVar1 = _stderr;
          ec_4 = CVar3;
          if (CVar3 != CURLM_OK) {
            uVar4 = curl_easy_strerror(CVar3);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                          ,0x30,CVar3,uVar4);
            msg._4_4_ = ec_4;
          }
          if (msg._4_4_ == CURLE_OK) {
            CVar2 = curl_multi_add_handle(_i,multi);
            uVar1 = _stderr;
            local_60 = CVar2;
            if (CVar2 != CURLE_OK) {
              uVar4 = curl_multi_strerror(CVar2);
              curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                            ,0x32,CVar2,uVar4);
              msg._4_4_ = local_60;
            }
            if (msg._4_4_ == CURLE_OK) {
              CVar2 = curl_multi_perform(_i,&res);
              uVar1 = _stderr;
              local_64 = CVar2;
              if (CVar2 == CURLE_OK) {
                if (res < 0) {
                  curl_mfprintf(_stderr,
                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                                ,0x34,res);
                  msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_SSL_CERTPROBLEM;
                }
              }
              else {
                uVar4 = curl_multi_strerror(CVar2);
                curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                              ,0x34,CVar2,uVar4);
                msg._4_4_ = local_64;
              }
              if (msg._4_4_ == CURLE_OK) {
                _auStack_78 = tutil_tvnow();
                tVar6.tv_usec = tv_test_start.tv_usec;
                tVar6.tv_sec = tv_test_start.tv_sec;
                lVar5 = tutil_tvdiff(_auStack_78,tVar6);
                if (60000 < lVar5) {
                  curl_mfprintf(_stderr,
                                "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                                ,0x36);
                  msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_BAD_CONTENT_ENCODING;
                }
                while (msg._4_4_ == CURLE_OK) {
                  if (res == 0) {
                    local_40 = curl_multi_info_read(_i,&res);
                    if (local_40 != 0) {
                      local_30 = *(CURLcode *)(local_40 + 0x10);
                    }
                    break;
                  }
                  msg._4_4_ = curl_multi_wait(_i,0,0,60000,local_7c);
                  if (msg._4_4_ != CURLE_OK) {
                    curl_mprintf("curl_multi_wait() returned %d\n",msg._4_4_);
                    msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_LDAP_INVALID_URL;
                    break;
                  }
                  tVar6 = tutil_tvnow();
                  older.tv_usec = tv_test_start.tv_usec;
                  older.tv_sec = tv_test_start.tv_sec;
                  lVar5 = tutil_tvdiff(tVar6,older);
                  if (60000 < lVar5) {
                    curl_mfprintf(_stderr,
                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                                  ,0x41);
                    msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_BAD_CONTENT_ENCODING;
                  }
                  if (msg._4_4_ != CURLE_OK) break;
                  CVar2 = curl_multi_perform(_i,&res);
                  uVar1 = _stderr;
                  if (CVar2 == CURLE_OK) {
                    if (res < 0) {
                      curl_mfprintf(_stderr,
                                    "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                                    ,0x43,res);
                      msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_SSL_CERTPROBLEM;
                    }
                  }
                  else {
                    uVar4 = curl_multi_strerror(CVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                                  ,0x43,CVar2,uVar4);
                    msg._4_4_ = CVar2;
                  }
                  if (msg._4_4_ != CURLE_OK) break;
                  tVar6 = tutil_tvnow();
                  older_00.tv_usec = tv_test_start.tv_usec;
                  older_00.tv_sec = tv_test_start.tv_sec;
                  lVar5 = tutil_tvdiff(tVar6,older_00);
                  if (60000 < lVar5) {
                    curl_mfprintf(_stderr,
                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1500.c"
                                  ,0x45);
                    msg._4_4_ = CURLE_USE_SSL_FAILED|CURLE_BAD_CONTENT_ENCODING;
                  }
                }
              }
            }
          }
        }
      }
    }
    curl_multi_cleanup(_i);
    curl_easy_cleanup(multi);
    curl_global_cleanup();
    if (msg._4_4_ != CURLE_OK) {
      local_30 = msg._4_4_;
    }
    URL_local._4_4_ = local_30;
  }
  else {
    URL_local._4_4_ = msg._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  CURLM *multi = NULL;
  int still_running;
  int i = TEST_ERR_FAILURE;
  int res = 0;
  CURLMsg *msg;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(curls);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);

  multi_add_handle(multi, curls);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    int num;
    res = curl_multi_wait(multi, NULL, 0, TEST_HANG_TIMEOUT, &num);
    if(res != CURLM_OK) {
      printf("curl_multi_wait() returned %d\n", res);
      res = TEST_ERR_MAJOR_BAD;
      goto test_cleanup;
    }

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &still_running);
  if(msg)
    /* this should now contain a result code from the easy handle,
       get it */
    i = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}